

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O1

Int32 __thiscall
Diligent::
DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>::
GetUniqueID(DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>
            *this)

{
  string msg;
  string local_30;
  
  if (this->m_UniqueID == 0) {
    FormatString<char[103]>
              (&local_30,
               (char (*) [103])
               "Unique ID is not initialized. This indicates that this device object has been created without a device"
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetUniqueID",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
               ,0xa1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return this->m_UniqueID;
}

Assistant:

GetUniqueID() const override final
    {
        VERIFY(m_UniqueID != 0, "Unique ID is not initialized. This indicates that this device object has been created without a device");
        return m_UniqueID;
    }